

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O1

int __thiscall
cpp_client::Connection::connect(Connection *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  undefined8 in_RAX;
  ostream *poVar2;
  size_t sVar3;
  undefined4 in_register_00000034;
  char *__s;
  undefined8 uStack_28;
  
  __s = (char *)CONCAT44(in_register_00000034,__fd);
  uStack_28 = in_RAX;
  if (__len != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[",2);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x24);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"m",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Connecting to: ",0xf);
    if (__s == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x13b1e0);
    }
    else {
      sVar3 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    uStack_28 = CONCAT17(10,(undefined7)uStack_28);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(char *)((long)&uStack_28 + 7),1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\x1b[",2);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"m",1);
  }
  iVar1 = Connection_internal::connect
                    ((this->conn_)._M_t.
                     super___uniq_ptr_impl<cpp_client::Connection_internal,_std::default_delete<cpp_client::Connection_internal>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cpp_client::Connection_internal_*,_std::default_delete<cpp_client::Connection_internal>_>
                     .super__Head_base<0UL,_cpp_client::Connection_internal_*,_false>._M_head_impl,
                     __fd,(sockaddr *)((ulong)__addr & 0xffffffff),__len);
  return iVar1;
}

Assistant:

void Connection::connect(const char* host, unsigned port, bool print)
{
   if(print)
   {
      std::cout << sgr::text_cyan << "Connecting to: " << host << ":" << port << '\n' << sgr::reset;
   }
   conn_->connect(host, port);
}